

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O1

void __thiscall
phmap::priv::anon_unknown_0::Btree_ComparableMap_Test::TestBody(Btree_ComparableMap_Test *this)

{
  pointer *__ptr;
  char *pcVar1;
  AssertionResult gtest_ar;
  btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_> s2;
  btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_> s1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  pair<int,_int> local_50;
  pair<int,_int> local_48;
  AssertHelper local_40;
  btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
  local_38;
  btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
  local_20;
  
  local_38.root_.
  super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
        )&DAT_200000001;
  btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,false>>>
  ::btree_set_container<std::pair<int,int>const*>
            ((btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,false>>>
              *)&local_20,(pair<int,_int> *)&local_38,(pair<int,_int> *)&local_38.rightmost_,
             (key_compare *)&local_50,(allocator_type *)&local_58);
  local_50.first = 2;
  local_50.second = 3;
  btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,false>>>
  ::btree_set_container<std::pair<int,int>const*>
            ((btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,false>>>
              *)&local_38,&local_50,&local_48,(key_compare *)&local_58,(allocator_type *)&local_40);
  testing::internal::
  CmpHelperLT<phmap::btree_map<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>,phmap::btree_map<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>>
            ((internal *)&local_50,"s1","s2",
             (btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             &local_20,
             (btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             &local_38);
  if ((char)local_50.first == '\0') {
    testing::Message::Message((Message *)&local_58);
    if (local_48 == (pair<int,_int>)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)local_48;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x6f2,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_58._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_58._M_head_impl + 8))();
    }
  }
  if (local_48 != (pair<int,_int>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  }
  testing::internal::
  CmpHelperLE<phmap::btree_map<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>,phmap::btree_map<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>>
            ((internal *)&local_50,"s1","s2",
             (btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             &local_20,
             (btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             &local_38);
  if ((char)local_50.first == '\0') {
    testing::Message::Message((Message *)&local_58);
    if (local_48 == (pair<int,_int>)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)local_48;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x6f3,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_58._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_58._M_head_impl + 8))();
    }
  }
  if (local_48 != (pair<int,_int>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  }
  testing::internal::
  CmpHelperLE<phmap::btree_map<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>,phmap::btree_map<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>>
            ((internal *)&local_50,"s1","s1",
             (btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             &local_20,
             (btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             &local_20);
  if ((char)local_50.first == '\0') {
    testing::Message::Message((Message *)&local_58);
    if (local_48 == (pair<int,_int>)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)local_48;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x6f4,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_58._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_58._M_head_impl + 8))();
    }
  }
  if (local_48 != (pair<int,_int>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  }
  testing::internal::
  CmpHelperGT<phmap::btree_map<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>,phmap::btree_map<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>>
            ((internal *)&local_50,"s2","s1",
             (btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             &local_38,
             (btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             &local_20);
  if ((char)local_50.first == '\0') {
    testing::Message::Message((Message *)&local_58);
    if (local_48 == (pair<int,_int>)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)local_48;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x6f5,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_58._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_58._M_head_impl + 8))();
    }
  }
  if (local_48 != (pair<int,_int>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  }
  testing::internal::
  CmpHelperGE<phmap::btree_map<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>,phmap::btree_map<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>>
            ((internal *)&local_50,"s2","s1",
             (btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             &local_38,
             (btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             &local_20);
  if ((char)local_50.first == '\0') {
    testing::Message::Message((Message *)&local_58);
    if (local_48 == (pair<int,_int>)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)local_48;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x6f6,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_58._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_58._M_head_impl + 8))();
    }
  }
  if (local_48 != (pair<int,_int>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  }
  testing::internal::
  CmpHelperGE<phmap::btree_map<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>,phmap::btree_map<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>>
            ((internal *)&local_50,"s1","s1",
             (btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             &local_20,
             (btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             &local_20);
  if ((char)local_50.first == '\0') {
    testing::Message::Message((Message *)&local_58);
    if (local_48 == (pair<int,_int>)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)local_48;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x6f7,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_58._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_58._M_head_impl + 8))();
    }
  }
  if (local_48 != (pair<int,_int>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  }
  btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
  ::~btree(&local_38);
  btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
  ::~btree(&local_20);
  return;
}

Assistant:

TEST(Btree, ComparableMap) {
        phmap::btree_map<int, int> s1 = {{1, 2}};
        phmap::btree_map<int, int> s2 = {{2, 3}};
        EXPECT_LT(s1, s2);
        EXPECT_LE(s1, s2);
        EXPECT_LE(s1, s1);
        EXPECT_GT(s2, s1);
        EXPECT_GE(s2, s1);
        EXPECT_GE(s1, s1);
    }